

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int websocket_connect(char *address,websocket_settings_s settings)

{
  intptr_t iVar1;
  long lVar2;
  code **ppcVar3;
  undefined8 *puVar4;
  byte bVar5;
  http_settings_s in_stack_fffffffffffffef8;
  code *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined8 *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  bVar5 = 0;
  local_68 = (undefined8 *)fio_malloc(0x30);
  local_68[4] = settings.on_close;
  local_68[5] = settings.udata;
  local_68[2] = settings.on_ready;
  local_68[3] = settings.on_shutdown;
  *local_68 = settings.on_message;
  local_68[1] = settings.on_open;
  uStack_80 = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  uStack_10 = 0;
  local_88 = on_websocket_http_connected;
  local_78 = on_websocket_http_connected;
  pcStack_70 = on_websocket_http_connection_finished;
  ppcVar3 = &local_88;
  puVar4 = (undefined8 *)&stack0xfffffffffffffef8;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *ppcVar3;
    ppcVar3 = ppcVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  iVar1 = http_connect(address,(char *)0x0,in_stack_fffffffffffffef8);
  return (int)iVar1;
}

Assistant:

int websocket_connect(const char *address, websocket_settings_s settings) {
  websocket_settings_s *s = fio_malloc(sizeof(*s));
  *s = settings;
  return http_connect(address, NULL, .on_request = on_websocket_http_connected,
                      .on_response = on_websocket_http_connected,
                      .on_finish = on_websocket_http_connection_finished,
                      .udata = s);
}